

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.c
# Opt level: O0

void ERR_add_error_vdata(int num,va_list args)

{
  char *pcVar1;
  int iVar2;
  ERR_STATE *src;
  size_t sVar3;
  char *p;
  ERR_STATE *es;
  char *arg;
  char *str;
  int flags;
  int size;
  int len;
  int i;
  long *in_stack_ffffffffffffffa8;
  va_list in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  char *__s;
  char *local_28;
  int local_1c;
  int local_18;
  int local_4;
  
  src = ossl_err_get_state_int();
  if (src != (ERR_STATE *)0x0) {
    iVar2 = src->top;
    if ((src->err_data_flags[iVar2] & 3U) == 3) {
      local_28 = src->err_data[iVar2];
      local_1c = (int)src->err_data_size[iVar2];
      src->err_data[iVar2] = (char *)0x0;
      src->err_data_flags[iVar2] = 0;
    }
    else {
      local_1c = 0x51;
      local_28 = (char *)CRYPTO_malloc(0x51,"crypto/err/err.c",0x334);
      if (local_28 == (char *)0x0) {
        return;
      }
      *local_28 = '\0';
    }
    sVar3 = strlen(local_28);
    local_18 = (int)sVar3;
    local_4 = num;
    while (local_4 = local_4 + -1, -1 < local_4) {
      in_stack_ffffffffffffffbc = *args;
      if (in_stack_ffffffffffffffbc < 0x29) {
        in_stack_ffffffffffffffa8 =
             (long *)((long)(int)in_stack_ffffffffffffffbc + *(long *)((long)args + 0x10));
        *(uint *)args = in_stack_ffffffffffffffbc + 8;
      }
      else {
        in_stack_ffffffffffffffa8 = *(long **)((long)args + 8);
        *(long **)((long)args + 8) = in_stack_ffffffffffffffa8 + 1;
      }
      __s = (char *)*in_stack_ffffffffffffffa8;
      if (__s == (char *)0x0) {
        __s = "<NULL>";
      }
      in_stack_ffffffffffffffb0 = args;
      sVar3 = strlen(__s);
      local_18 = local_18 + (int)sVar3;
      pcVar1 = local_28;
      if (local_1c <= local_18) {
        local_1c = local_18 + 0x14;
        in_stack_ffffffffffffffc0 =
             (char *)CRYPTO_realloc(local_28,local_1c,"crypto/err/err.c",0x344);
        pcVar1 = in_stack_ffffffffffffffc0;
        if (in_stack_ffffffffffffffc0 == (char *)0x0) {
          CRYPTO_free(local_28);
          return;
        }
      }
      local_28 = pcVar1;
      OPENSSL_strlcat(__s,(char *)src,(size_t)in_stack_ffffffffffffffc0);
    }
    iVar2 = err_set_error_data_int
                      ((char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       (size_t)in_stack_ffffffffffffffb0,
                       (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                       (int)in_stack_ffffffffffffffa8);
    if (iVar2 == 0) {
      CRYPTO_free(local_28);
    }
  }
  return;
}

Assistant:

void ERR_add_error_vdata(int num, va_list args)
{
    int i, len, size;
    int flags = ERR_TXT_MALLOCED | ERR_TXT_STRING;
    char *str, *arg;
    ERR_STATE *es;

    /* Get the current error data; if an allocated string get it. */
    es = ossl_err_get_state_int();
    if (es == NULL)
        return;
    i = es->top;

    /*
     * If err_data is allocated already, re-use the space.
     * Otherwise, allocate a small new buffer.
     */
    if ((es->err_data_flags[i] & flags) == flags) {
        str = es->err_data[i];
        size = es->err_data_size[i];

        /*
         * To protect the string we just grabbed from tampering by other
         * functions we may call, or to protect them from freeing a pointer
         * that may no longer be valid at that point, we clear away the
         * data pointer and the flags.  We will set them again at the end
         * of this function.
         */
        es->err_data[i] = NULL;
        es->err_data_flags[i] = 0;
    } else if ((str = OPENSSL_malloc(size = 81)) == NULL) {
        return;
    } else {
        str[0] = '\0';
    }
    len = strlen(str);

    while (--num >= 0) {
        arg = va_arg(args, char *);
        if (arg == NULL)
            arg = "<NULL>";
        len += strlen(arg);
        if (len >= size) {
            char *p;

            size = len + 20;
            p = OPENSSL_realloc(str, size);
            if (p == NULL) {
                OPENSSL_free(str);
                return;
            }
            str = p;
        }
        OPENSSL_strlcat(str, arg, (size_t)size);
    }
    if (!err_set_error_data_int(str, size, flags, 0))
        OPENSSL_free(str);
}